

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryManagerVk.cpp
# Opt level: O0

void __thiscall Diligent::QueryManagerVk::~QueryManagerVk(QueryManagerVk *this)

{
  undefined *puVar1;
  bool bVar2;
  _Setw _Var3;
  Uint32 UVar4;
  reference this_00;
  ostream *poVar5;
  char *pcVar6;
  void *this_01;
  undefined8 uVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *Args;
  Diligent local_1f8 [32];
  undefined1 local_1d8 [8];
  string _msg;
  value_type *PoolInfo;
  stringstream local_198 [4];
  Uint32 QueryType;
  stringstream QueryUsageSS;
  ostream local_188 [376];
  QueryManagerVk *local_10;
  QueryManagerVk *this_local;
  
  local_10 = this;
  std::__cxx11::stringstream::stringstream(local_198);
  std::operator<<(local_188,"Vulkan query manager peak usage:");
  for (PoolInfo._4_4_ = QUERY_TYPE_OCCLUSION; PoolInfo._4_4_ < QUERY_TYPE_NUM_TYPES;
      PoolInfo._4_4_ = PoolInfo._4_4_ + QUERY_TYPE_OCCLUSION) {
    this_00 = std::array<Diligent::QueryManagerVk::QueryPoolInfo,_6UL>::operator[]
                        (&this->m_Pools,(ulong)PoolInfo._4_4_);
    bVar2 = QueryPoolInfo::IsNull(this_00);
    if (!bVar2) {
      poVar5 = (ostream *)std::ostream::operator<<(local_188,std::endl<char,std::char_traits<char>>)
      ;
      _Var3 = std::setw(0x1e);
      poVar5 = std::operator<<(poVar5,_Var3);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::left);
      pcVar6 = GetQueryTypeString(PoolInfo._4_4_);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,": ");
      _Var3 = std::setw(4);
      poVar5 = std::operator<<(poVar5,_Var3);
      this_01 = (void *)std::ostream::operator<<(poVar5,std::right);
      UVar4 = QueryPoolInfo::GetMaxAllocatedQueries(this_00);
      poVar5 = (ostream *)std::ostream::operator<<(this_01,UVar4);
      poVar5 = std::operator<<(poVar5,'/');
      _msg.field_2._12_4_ = std::setw(4);
      poVar5 = std::operator<<(poVar5,(_Setw)_msg.field_2._12_4_);
      UVar4 = QueryPoolInfo::GetQueryCount(this_00);
      std::ostream::operator<<(poVar5,UVar4);
    }
  }
  std::__cxx11::stringstream::str();
  FormatString<std::__cxx11::string>((string *)local_1d8,local_1f8,Args);
  std::__cxx11::string::~string((string *)local_1f8);
  puVar1 = DebugMessageCallback;
  if (DebugMessageCallback != (undefined *)0x0) {
    uVar7 = std::__cxx11::string::c_str();
    (*(code *)puVar1)(0,uVar7,0);
  }
  std::__cxx11::string::~string((string *)local_1d8);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::array<Diligent::QueryManagerVk::QueryPoolInfo,_6UL>::~array(&this->m_Pools);
  return;
}

Assistant:

QueryManagerVk::~QueryManagerVk()
{
    std::stringstream QueryUsageSS;
    QueryUsageSS << "Vulkan query manager peak usage:";
    for (Uint32 QueryType = QUERY_TYPE_UNDEFINED + 1; QueryType < QUERY_TYPE_NUM_TYPES; ++QueryType)
    {
        auto& PoolInfo = m_Pools[QueryType];
        if (PoolInfo.IsNull())
            continue;

        QueryUsageSS << std::endl
                     << std::setw(30) << std::left << GetQueryTypeString(static_cast<QUERY_TYPE>(QueryType)) << ": "
                     << std::setw(4) << std::right << PoolInfo.GetMaxAllocatedQueries()
                     << '/' << std::setw(4) << PoolInfo.GetQueryCount();
    }
    LOG_INFO_MESSAGE(QueryUsageSS.str());
}